

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commissioner_safe.cpp
# Opt level: O2

void __thiscall
ot::commissioner::CommissionerSafe::CommandReenroll
          (CommissionerSafe *this,ErrorHandler *aHandler,string *aDstAddr)

{
  _func_void *p_Var1;
  _Any_data local_98;
  code *local_88;
  code *pcStack_80;
  CommissionerSafe *local_70;
  _Any_data local_68;
  long local_58;
  undefined8 uStack_50;
  string local_48 [32];
  
  local_70 = this;
  std::function<void_(ot::commissioner::Error)>::function
            ((function<void_(ot::commissioner::Error)> *)&local_68,aHandler);
  std::__cxx11::string::string(local_48,(string *)aDstAddr);
  local_88 = (code *)0x0;
  pcStack_80 = (code *)0x0;
  local_98._M_unused._M_object = (void *)0x0;
  local_98._8_8_ = 0;
  p_Var1 = (_func_void *)operator_new(0x48);
  *(CommissionerSafe **)p_Var1 = local_70;
  *(undefined8 *)(p_Var1 + 8) = 0;
  *(undefined8 *)(p_Var1 + 0x10) = 0;
  *(undefined8 *)(p_Var1 + 0x18) = 0;
  *(undefined8 *)(p_Var1 + 0x20) = uStack_50;
  if (local_58 != 0) {
    *(void **)(p_Var1 + 8) = local_68._M_unused._M_object;
    *(undefined8 *)(p_Var1 + 0x10) = local_68._8_8_;
    *(long *)(p_Var1 + 0x18) = local_58;
    local_58 = 0;
    uStack_50 = 0;
  }
  std::__cxx11::string::string((string *)(p_Var1 + 0x28),local_48);
  pcStack_80 = std::
               _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/library/commissioner_safe.cpp:399:22)>
               ::_M_invoke;
  local_88 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/library/commissioner_safe.cpp:399:22)>
             ::_M_manager;
  local_98._M_unused._0_8_ = (undefined8)p_Var1;
  PushAsyncRequest(this,(AsyncRequest *)&local_98);
  std::_Function_base::~_Function_base((_Function_base *)&local_98);
  CommandReenroll(std::function<void(ot::commissioner::Error)>,std::__cxx11::string_const&)::$_0::
  ~__0((__0 *)&local_70);
  return;
}

Assistant:

void CommissionerSafe::CommandReenroll(ErrorHandler aHandler, const std::string &aDstAddr)
{
    PushAsyncRequest([=]() { mImpl->CommandReenroll(aHandler, aDstAddr); });
}